

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

void SUNDlsMat_denseScale(realtype c,realtype **a,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < n) {
    uVar2 = 0;
    do {
      if (0 < m) {
        prVar1 = a[uVar2];
        uVar3 = 0;
        do {
          prVar1[uVar3] = prVar1[uVar3] * c;
          uVar3 = uVar3 + 1;
        } while ((uint)m != uVar3);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)n);
  }
  return;
}

Assistant:

void SUNDlsMat_denseScale(realtype c, realtype **a, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (j=0; j < n; j++) {
    col_j = a[j];
    for (i=0; i < m; i++)
      col_j[i] *= c;
  }
}